

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void console_sigwinch_handler(int signal)

{
  bool bVar1;
  
  bVar1 = console_is_init();
  if (bVar1) {
    endwin();
    erase();
    refresh();
    if (stt_visible == true) {
      wresize(cmd_win,3,_COLS - stt_width);
      wresize(out_win,_LINES + -3,_COLS - stt_width);
      wresize(stt_win,_LINES,stt_width);
      mvwin(stt_win,0,_COLS - stt_width);
    }
    else {
      wresize(cmd_win,3,_COLS);
      wresize(out_win,_LINES + -3,_COLS);
    }
    cmd_tab_counter = 0;
    console_refresh();
    return;
  }
  return;
}

Assistant:

void console_sigwinch_handler(int signal) {
    #if defined(SUPPORT_NCURSES)

    if (!console_is_init())
        return;

    endwin();
    erase();
    refresh();

    if (stt_visible) {
        wresize(cmd_win, 3, COLS - stt_width );
        wresize(out_win, LINES - 3, COLS - stt_width);

        // wresize(stt_win, stt_win_height, stt_width );
        wresize(stt_win, LINES, stt_width );
        mvwin(stt_win, 0, COLS - stt_width );

    }
    else {
        wresize(cmd_win, 3, COLS);
        wresize(out_win, LINES - 3, COLS);
    }

    cmd_tab_counter = 0;

    console_refresh();
    #endif
}